

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_file.hpp
# Opt level: O1

bool __thiscall iutest::StdioFile::OpenImpl(StdioFile *this,char *filename,int mode)

{
  FILE *pFVar1;
  
  (*(this->super_IFile).super_IOutStream._vptr_IOutStream[4])();
  if (mode - 1U < 3) {
    pFVar1 = fopen64(filename,&DAT_00133ba0 + *(int *)(&DAT_00133ba0 + (ulong)(mode - 1U) * 4));
    this->m_fp = (FILE *)pFVar1;
  }
  return this->m_fp != (FILE *)0x0;
}

Assistant:

virtual bool OpenImpl(const char* filename, int mode) IUTEST_CXX_OVERRIDE
    {
        Close();
        switch( mode )
        {
        case IFile::OpenRead:
            m_fp = internal::posix::FileOpen(filename, "rb");
            break;
        case IFile::OpenWrite:
            m_fp = internal::posix::FileOpen(filename, "wb");
            break;
        case IFile::OpenAppend:
            m_fp = internal::posix::FileOpen(filename, "ab");
            break;
        default:
            break;
        }
        return m_fp != NULL;
    }